

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,false,false,false,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  int iVar2;
  int iVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  sel_t sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  
  if (count + 0x3f < 0x40) {
    lVar19 = 0;
  }
  else {
    puVar4 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar19 = 0;
    uVar9 = 0;
    uVar14 = 0;
    do {
      uVar20 = uVar9;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar15 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar15 = count;
        }
LAB_00ef1fb4:
        if (uVar9 < uVar15) {
          psVar5 = sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          uVar18 = uVar9 << 4 | 8;
          do {
            uVar20 = uVar9;
            if (psVar5 != (sel_t *)0x0) {
              uVar20 = (ulong)psVar5[uVar9];
            }
            iVar1 = *(int *)((long)ldata + (uVar18 - 8));
            iVar2 = *(int *)((long)rdata + (uVar18 - 8));
            iVar3 = *(int *)((long)ldata + (uVar18 - 4));
            iVar16 = *(int *)((long)rdata + (uVar18 - 4));
            lVar7 = *(long *)((long)&ldata->months + uVar18);
            lVar8 = *(long *)((long)&rdata->months + uVar18);
            if ((iVar16 != iVar3 || iVar2 != iVar1) || (uVar11 = 1, iVar16 = iVar3, lVar7 != lVar8))
            {
              lVar10 = (long)iVar3 + lVar7 / 86400000000;
              lVar17 = (long)iVar16 + lVar8 / 86400000000;
              if ((long)iVar1 + lVar10 / 0x1e == (long)iVar2 + lVar17 / 0x1e) {
                uVar11 = 0;
                if (lVar10 % 0x1e == lVar17 % 0x1e) {
                  uVar11 = (ulong)(lVar7 % 86400000000 == lVar8 % 86400000000);
                }
              }
              else {
                uVar11 = 0;
              }
            }
            psVar6[lVar19] = (sel_t)uVar20;
            lVar19 = uVar11 + lVar19;
            uVar9 = uVar9 + 1;
            uVar18 = uVar18 + 0x10;
            uVar20 = uVar15;
          } while (uVar15 != uVar9);
        }
      }
      else {
        uVar18 = puVar4[uVar14];
        uVar15 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar15 = count;
        }
        if (uVar18 == 0xffffffffffffffff) goto LAB_00ef1fb4;
        if (uVar18 == 0) {
          uVar20 = uVar15;
          if (uVar9 < uVar15) {
            psVar5 = sel->sel_vector;
            psVar6 = false_sel->sel_vector;
            do {
              sVar12 = (sel_t)uVar9;
              if (psVar5 != (sel_t *)0x0) {
                sVar12 = psVar5[uVar9];
              }
              psVar6[lVar19] = sVar12;
              lVar19 = lVar19 + 1;
              uVar9 = uVar9 + 1;
            } while (uVar15 != uVar9);
          }
        }
        else if (uVar9 < uVar15) {
          psVar5 = sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          uVar13 = uVar9 << 4 | 8;
          uVar11 = 0;
          do {
            if (psVar5 == (sel_t *)0x0) {
              sVar12 = (int)uVar9 + (int)uVar11;
            }
            else {
              sVar12 = psVar5[uVar9 + uVar11];
            }
            uVar20 = 1;
            if ((uVar18 >> (uVar11 & 0x3f) & 1) != 0) {
              iVar1 = *(int *)((long)ldata + (uVar13 - 8));
              iVar2 = *(int *)((long)rdata + (uVar13 - 8));
              iVar3 = *(int *)((long)ldata + (uVar13 - 4));
              iVar16 = *(int *)((long)rdata + (uVar13 - 4));
              lVar7 = *(long *)((long)&ldata->months + uVar13);
              lVar8 = *(long *)((long)&rdata->months + uVar13);
              if ((iVar16 != iVar3 || iVar2 != iVar1) || (iVar16 = iVar3, lVar7 != lVar8)) {
                lVar10 = (long)iVar3 + lVar7 / 86400000000;
                lVar17 = (long)iVar16 + lVar8 / 86400000000;
                if ((long)iVar1 + lVar10 / 0x1e == (long)iVar2 + lVar17 / 0x1e) {
                  uVar20 = 0;
                  if (lVar10 % 0x1e == lVar17 % 0x1e) {
                    uVar20 = (ulong)(lVar7 % 86400000000 == lVar8 % 86400000000);
                  }
                }
                else {
                  uVar20 = 0;
                }
              }
            }
            psVar6[lVar19] = sVar12;
            lVar19 = uVar20 + lVar19;
            uVar11 = uVar11 + 1;
            uVar13 = uVar13 + 0x10;
            uVar20 = uVar15;
          } while (uVar15 - uVar9 != uVar11);
        }
      }
      uVar9 = uVar20;
      uVar14 = uVar14 + 1;
    } while (uVar14 != count + 0x3f >> 6);
  }
  return count - lVar19;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}